

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderLineStrip<ImPlot::GetterYs<float>,ImPlot::TransformerLogLin>
               (GetterYs<float> *getter,TransformerLogLin *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  ImPlotPlot *pIVar4;
  double dVar5;
  ImPlotContext *pIVar6;
  ImPlotContext *pIVar7;
  int iVar8;
  int iVar9;
  ImPlotContext *gp;
  float fVar10;
  float fVar11;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_68;
  ImDrawList *local_60;
  undefined1 local_58 [8];
  TransformerLogLin *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar6 = GImPlot;
  pIVar4 = GImPlot->CurrentPlot;
  local_60 = DrawList;
  if (((pIVar4->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar8 = getter->Count;
    local_48 = iVar8 + -1;
    local_3c.x = 0.0;
    local_3c.y = 0.0;
    fVar2 = *(float *)((long)getter->Ys +
                      (long)((getter->Offset % iVar8 + iVar8) % iVar8) * (long)getter->Stride);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    dVar5 = log10((getter->XScale * 0.0 + getter->X0) / (pIVar4->XAxis).Range.Min);
    pIVar4 = pIVar6->CurrentPlot;
    dVar3 = (pIVar4->XAxis).Range.Min;
    iVar8 = transformer->YAxis;
    local_3c.y = (float)(((double)fVar2 - pIVar4->YAxis[iVar8].Range.Min) * pIVar6->My[iVar8] +
                        (double)pIVar6->PixelRange[iVar8].Min.y);
    local_3c.x = (float)((((double)(float)(dVar5 / pIVar6->LogDenX) *
                           ((pIVar4->XAxis).Range.Max - dVar3) + dVar3) - dVar3) * pIVar6->Mx +
                        (double)pIVar6->PixelRange[iVar8].Min.x);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterYs<float>,ImPlot::TransformerLogLin>>
              ((LineStripRenderer<ImPlot::GetterYs<float>,_ImPlot::TransformerLogLin> *)local_58,
               local_60,&pIVar4->PlotRect);
  }
  else {
    iVar8 = getter->Count;
    fVar2 = *(float *)((long)getter->Ys +
                      (long)((getter->Offset % iVar8 + iVar8) % iVar8) * (long)getter->Stride);
    dVar5 = log10((getter->XScale * 0.0 + getter->X0) / (pIVar4->XAxis).Range.Min);
    pIVar4 = pIVar6->CurrentPlot;
    dVar3 = (pIVar4->XAxis).Range.Min;
    iVar8 = transformer->YAxis;
    local_58._4_4_ =
         (float)(((double)fVar2 - pIVar4->YAxis[iVar8].Range.Min) * pIVar6->My[iVar8] +
                (double)pIVar6->PixelRange[iVar8].Min.y);
    local_58._0_4_ =
         (float)((((double)(float)(dVar5 / pIVar6->LogDenX) * ((pIVar4->XAxis).Range.Max - dVar3) +
                  dVar3) - dVar3) * pIVar6->Mx + (double)pIVar6->PixelRange[iVar8].Min.x);
    iVar8 = getter->Count;
    if (1 < iVar8) {
      iVar9 = 1;
      do {
        pIVar7 = GImPlot;
        fVar2 = *(float *)((long)getter->Ys +
                          (long)(((getter->Offset + iVar9) % iVar8 + iVar8) % iVar8) *
                          (long)getter->Stride);
        dVar5 = log10(((double)iVar9 * getter->XScale + getter->X0) /
                      (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar4 = pIVar7->CurrentPlot;
        dVar3 = (pIVar4->XAxis).Range.Min;
        iVar8 = transformer->YAxis;
        fVar10 = (float)((((double)(float)(dVar5 / pIVar7->LogDenX) *
                           ((pIVar4->XAxis).Range.Max - dVar3) + dVar3) - dVar3) * pIVar7->Mx +
                        (double)pIVar7->PixelRange[iVar8].Min.x);
        fVar11 = (float)(((double)fVar2 - pIVar4->YAxis[iVar8].Range.Min) * pIVar7->My[iVar8] +
                        (double)pIVar7->PixelRange[iVar8].Min.y);
        local_68.y = fVar11;
        local_68.x = fVar10;
        pIVar4 = pIVar6->CurrentPlot;
        fVar2 = (float)local_58._4_4_;
        if (fVar11 <= (float)local_58._4_4_) {
          fVar2 = fVar11;
        }
        if ((fVar2 < (pIVar4->PlotRect).Max.y) &&
           (fVar2 = (float)(~-(uint)(fVar11 <= (float)local_58._4_4_) & (uint)fVar11 |
                           local_58._4_4_ & -(uint)(fVar11 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          fVar2 = (float)local_58._0_4_;
          if (fVar10 <= (float)local_58._0_4_) {
            fVar2 = fVar10;
          }
          if ((fVar2 < (pIVar4->PlotRect).Max.x) &&
             (fVar2 = (float)(~-(uint)(fVar10 <= (float)local_58._0_4_) & (uint)fVar10 |
                             local_58._0_4_ & -(uint)(fVar10 <= (float)local_58._0_4_)),
             (pIVar4->PlotRect).Min.x <= fVar2 && fVar2 != (pIVar4->PlotRect).Min.x)) {
            ImDrawList::AddLine(local_60,(ImVec2 *)local_58,&local_68,col,line_weight);
          }
        }
        local_58._0_4_ = local_68.x;
        local_58._4_4_ = local_68.y;
        iVar9 = iVar9 + 1;
        iVar8 = getter->Count;
      } while (iVar9 < iVar8);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}